

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O1

void Dtt_ManProcessVisited(Dtt_Man_t *p)

{
  int iVar1;
  long lVar2;
  Vec_Int_t *pVVar3;
  
  pVVar3 = p->vVisited;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      iVar1 = pVVar3->pArray[lVar2];
      if (p->pVisited[iVar1] == '\0') {
        __assert_fail("p->pVisited[Class]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                      ,0x188,"void Dtt_ManProcessVisited(Dtt_Man_t *)");
      }
      p->pVisited[iVar1] = '\0';
      p->pTimes[iVar1] = p->pTimes[iVar1] + 1;
      lVar2 = lVar2 + 1;
      pVVar3 = p->vVisited;
    } while (lVar2 < pVVar3->nSize);
  }
  pVVar3->nSize = 0;
  return;
}

Assistant:

void Dtt_ManProcessVisited( Dtt_Man_t * p )
{
    int i, Class;
    Vec_IntForEachEntry( p->vVisited, Class, i )
    {
        assert( p->pVisited[Class] );
        p->pVisited[Class] = 0;
        p->pTimes[Class]++;
    }
    Vec_IntClear( p->vVisited );
}